

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O1

void GraphTask::setup(search *sch,multi_ex *ec)

{
  pointer *ppuVar1;
  uint uVar2;
  task_data *D;
  example *peVar3;
  pointer pvVar4;
  iterator iVar5;
  pointer puVar6;
  vw *pvVar7;
  ulong uVar8;
  ostream *poVar9;
  vw_exception *pvVar10;
  pointer ppeVar11;
  long lVar12;
  wclass *pwVar13;
  uint64_t *puVar14;
  uint32_t *puVar15;
  ulong uVar16;
  long lVar17;
  stringstream __msg;
  allocator_type local_259;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_258;
  value_type local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  D = (task_data *)sch->task_data;
  D->multiplier = D->wpp << ((byte)D->ss & 0x3f);
  pvVar7 = Search::search::get_vw_pointer_unsafe(sch);
  D->wpp = (ulong)pvVar7->wpp;
  pvVar7 = Search::search::get_vw_pointer_unsafe(sch);
  puVar14 = &(pvVar7->weights).dense_weights._weight_mask;
  if ((pvVar7->weights).sparse != false) {
    puVar14 = &(pvVar7->weights).sparse_weights._weight_mask;
  }
  D->mask = *puVar14;
  pvVar7 = Search::search::get_vw_pointer_unsafe(sch);
  puVar15 = &(pvVar7->weights).dense_weights._stride_shift;
  if ((pvVar7->weights).sparse != false) {
    puVar15 = &(pvVar7->weights).sparse_weights._stride_shift;
  }
  D->ss = (ulong)*puVar15;
  D->N = 0;
  D->E = 0;
  ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar11) {
    uVar8 = 0;
    do {
      if ((ulong)((long)(ppeVar11[uVar8]->l).cs.costs._end -
                 (long)(ppeVar11[uVar8]->l).cs.costs._begin) < 0x11) {
        if (D->E != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"error: got a node after getting edges!",0x26);
          pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar10,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                     ,0xcb,&local_1d8);
          __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        D->N = D->N + 1;
        peVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        pwVar13 = (peVar3->l).cs.costs._begin;
        if ((peVar3->l).cs.costs._end != pwVar13) {
          uVar2 = pwVar13->class_index;
          D->true_counts[uVar2] = D->true_counts[uVar2] + 1.0;
          D->true_counts_total = D->true_counts_total + 1.0;
        }
      }
      else {
        D->E = D->E + 1;
      }
      uVar8 = uVar8 + 1;
      ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3))
    ;
  }
  if (((ulong)D->N == 0) && (D->E != 0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),
               "error: got edges without any nodes (perhaps ring_size is too small?)!",0x45);
    pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
               ,0xd6,&local_1f8);
    __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_258,(ulong)D->N,&local_238,&local_259);
  local_1b8._0_8_ =
       (D->adj).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8._8_8_ =
       (D->adj).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8._16_8_ =
       (D->adj).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (D->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_258.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (D->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_258.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (D->adj).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_258.
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_1b8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_258);
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_258.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)D->N;
  ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (local_258.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start <
      (pointer)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3)) {
    do {
      pwVar13 = (ppeVar11[(long)local_258.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start]->l).cs.costs._begin;
      lVar12 = (long)(ppeVar11[(long)local_258.
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start]->l).cs.costs._end -
               (long)pwVar13;
      if (lVar12 != 0) {
        lVar12 = lVar12 >> 4;
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        lVar17 = 4;
        do {
          if (D->N < *(uint *)((long)&pwVar13->x + lVar17)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),
                       "error: edge source points to too large of a node id: ",0x35);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," > ",3);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                       ,0xe0,&local_218);
            __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          lVar17 = lVar17 + 0x10;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      peVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start
               [(long)local_258.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start];
      pwVar13 = (peVar3->l).cs.costs._begin;
      if ((peVar3->l).cs.costs._end != pwVar13) {
        lVar12 = 4;
        uVar8 = 0;
        do {
          uVar16 = (ulong)*(uint *)((long)&pwVar13->x + lVar12);
          if (uVar16 != 0) {
            pvVar4 = (D->adj).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar5._M_current =
                 *(pointer *)
                  ((long)&pvVar4[uVar16 - 1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
            if ((iVar5._M_current ==
                 pvVar4[uVar16 - 1].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start) ||
               ((pointer)iVar5._M_current[-1] !=
                local_258.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
              if (iVar5._M_current ==
                  *(pointer *)
                   ((long)&pvVar4[uVar16 - 1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                           (pvVar4 + (uVar16 - 1)),iVar5,(unsigned_long *)&local_258);
              }
              else {
                *iVar5._M_current =
                     (unsigned_long)
                     local_258.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                ppuVar1 = (pointer *)
                          ((long)&pvVar4[uVar16 - 1].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                *ppuVar1 = *ppuVar1 + 1;
              }
            }
          }
          uVar8 = uVar8 + 1;
          peVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start
                   [(long)local_258.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start];
          pwVar13 = (peVar3->l).cs.costs._begin;
          lVar12 = lVar12 + 0x10;
        } while (uVar8 < (ulong)((long)(peVar3->l).cs.costs._end - (long)pwVar13 >> 4));
      }
      local_258.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_258.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
      ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    } while (local_258.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start <
             (pointer)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3));
  }
  run_bfs(D,ec);
  puVar6 = (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
  }
  if (D->N != 0) {
    uVar8 = 0;
    do {
      local_1b8._0_8_ = D->K + 1;
      iVar5._M_current =
           (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&D->pred,iVar5,(unsigned_long *)local_1b8);
      }
      else {
        *iVar5._M_current = local_1b8._0_8_;
        ppuVar1 = &(D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < D->N);
  }
  return;
}

Assistant:

void setup(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  D.multiplier = D.wpp << D.ss;
  D.wpp = sch.get_vw_pointer_unsafe().wpp;
  D.mask = sch.get_vw_pointer_unsafe().weights.mask();
  D.ss = sch.get_vw_pointer_unsafe().weights.stride_shift();
  D.N = 0;
  D.E = 0;
  for (size_t i = 0; i < ec.size(); i++)
    if (example_is_edge(ec[i]))
      D.E++;
    else  // it's a node!
    {
      if (D.E > 0)
        THROW("error: got a node after getting edges!");

      D.N++;
      if (ec[i]->l.cs.costs.size() > 0)
      {
        D.true_counts[ec[i]->l.cs.costs[0].class_index] += 1.;
        D.true_counts_total += 1.;
      }
    }

  if ((D.N == 0) && (D.E > 0))
    THROW("error: got edges without any nodes (perhaps ring_size is too small?)!");

  D.adj = vector<vector<size_t>>(D.N, vector<size_t>(0));

  for (size_t i = D.N; i < ec.size(); i++)
  {
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      if (ec[i]->l.cs.costs[n].class_index > D.N)
        THROW("error: edge source points to too large of a node id: " << (ec[i]->l.cs.costs[n].class_index) << " > "
                                                                      << D.N);
    }
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      size_t nn = ec[i]->l.cs.costs[n].class_index;
      if ((nn > 0) &&
          (((D.adj[nn - 1].size() == 0) || (D.adj[nn - 1][D.adj[nn - 1].size() - 1] != i))))  // don't allow dups
        D.adj[nn - 1].push_back(i);
    }
  }

  run_bfs(D, ec);

  D.pred.clear();
  for (size_t n = 0; n < D.N; n++) D.pred.push_back(D.K + 1);
}